

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Input::scalarString(Input *this,StringRef *S,QuotingType param_2)

{
  HNode *hnode;
  StringRef SVar1;
  Twine local_50;
  char *local_38;
  size_t local_30;
  ret_type local_28;
  ScalarHNode *SN;
  StringRef *pSStack_18;
  QuotingType param_2_local;
  StringRef *S_local;
  Input *this_local;
  
  SN._4_4_ = param_2;
  pSStack_18 = S;
  S_local = (StringRef *)this;
  local_28 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  if (local_28 == (ret_type)0x0) {
    hnode = this->CurrentNode;
    Twine::Twine(&local_50,"unexpected scalar");
    setError(this,hnode,&local_50);
  }
  else {
    SVar1 = ScalarHNode::value(local_28);
    local_38 = SVar1.Data;
    pSStack_18->Data = local_38;
    local_30 = SVar1.Length;
    pSStack_18->Length = local_30;
  }
  return;
}

Assistant:

void Input::scalarString(StringRef &S, QuotingType) {
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    S = SN->value();
  } else {
    setError(CurrentNode, "unexpected scalar");
  }
}